

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.cpp
# Opt level: O2

var __thiscall cs::runtime_type::parse_gcnew(runtime_type *this,var *b)

{
  bool bVar1;
  type_info *this_00;
  runtime_error *this_01;
  any *in_RDX;
  allocator local_31;
  string local_30;
  
  this_00 = cs_impl::any::type(in_RDX);
  bVar1 = std::type_info::operator==(this_00,(type_info *)&type_t::typeinfo);
  if (bVar1) {
    cs_impl::any::const_val<cs::type_t>(in_RDX);
    std::function<cs_impl::any_()>::operator()((function<cs_impl::any_()> *)&local_30);
    cs_impl::any::make<cs::pointer,cs_impl::any>((any *)this,(any *)&local_30);
    cs_impl::any::recycle((any *)&local_30);
    return (var)(proxy *)this;
  }
  this_01 = (runtime_error *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string
            ((string *)&local_30,"Unsupported operator operations(GcNew).",&local_31);
  runtime_error::runtime_error(this_01,&local_30);
  __cxa_throw(this_01,&runtime_error::typeinfo,runtime_error::~runtime_error);
}

Assistant:

var runtime_type::parse_gcnew(const var &b)
	{
		if (b.type() == typeid(type_t))
			return var::make<pointer>(b.const_val<type_t>().constructor());
		else
			throw runtime_error("Unsupported operator operations(GcNew).");
	}